

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O1

string_view __thiscall cinatra::coro_http_request::get_boundary(coro_http_request *this)

{
  long lVar1;
  size_type sVar2;
  size_t sVar3;
  string_view key;
  string_view sVar4;
  string_view content_type;
  string_view local_10;
  
  key._M_str = "content-type";
  key._M_len = 0xc;
  local_10 = get_header_value(this,key);
  if (local_10._M_len == 0) {
    local_10._M_str = (char *)0x0;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                      (&local_10,"=",0xffffffffffffffff,1);
    if (sVar2 != 0xffffffffffffffff) {
      lVar1 = sVar2 + 1;
      if (local_10._M_len <= sVar2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   lVar1,local_10._M_len);
      }
      sVar3 = local_10._M_len - lVar1;
      local_10._M_str = local_10._M_str + lVar1;
      goto LAB_00184d9d;
    }
    local_10._M_str = "";
  }
  sVar3 = 0;
LAB_00184d9d:
  sVar4._M_str = local_10._M_str;
  sVar4._M_len = sVar3;
  return sVar4;
}

Assistant:

std::string_view get_boundary() {
    auto content_type = get_header_value("content-type");
    if (content_type.empty()) {
      return {};
    }

    auto pos = content_type.rfind("=");
    if (pos == std::string_view::npos) {
      return "";
    }

    return content_type.substr(pos + 1);
  }